

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wb_tree.c
# Opt level: O1

uint fixup(wb_tree *tree,wb_node *n)

{
  wb_node *pwVar1;
  wb_node *pwVar2;
  wb_node *pwVar3;
  wb_node *pwVar4;
  uint uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  void *key;
  uint32_t uVar8;
  uint32_t uVar9;
  
  pwVar4 = n->llink;
  if (pwVar4 == (wb_node *)0x0) {
    uVar5 = 1000;
  }
  else {
    uVar5 = pwVar4->weight * 1000;
  }
  if (uVar5 < n->weight * 0x125) {
    pwVar4 = n->rlink;
    if (pwVar4 == (wb_node *)0x0) {
      fixup_cold_4();
      goto LAB_001068ef;
    }
    pwVar3 = pwVar4->llink;
    if (pwVar3 == (wb_node *)0x0) {
      uVar5 = 1000;
    }
    else {
      uVar5 = pwVar3->weight * 1000;
    }
    if (uVar5 < pwVar4->weight * 0x24a) {
      tree_node_rot_left(tree,n);
      uVar6 = 1;
      uVar9 = 1;
      if (n->llink != (wb_node *)0x0) {
        uVar9 = n->llink->weight;
      }
      if (n->rlink != (wb_node *)0x0) {
        uVar6 = n->rlink->weight;
      }
      n->weight = uVar6 + uVar9;
      uVar7 = 1;
      if (pwVar4->rlink != (wb_node *)0x0) {
        uVar7 = pwVar4->rlink->weight;
      }
      pwVar4->weight = uVar7 + uVar6 + uVar9;
      return 1;
    }
    if (pwVar3 != (wb_node *)0x0) {
      pwVar1 = n->parent;
      pwVar3->parent = pwVar1;
      if (pwVar1 != (wb_node *)0x0) {
        tree = (wb_tree *)&pwVar1->rlink;
        if (pwVar1->llink == n) {
          tree = (wb_tree *)&pwVar1->llink;
        }
      }
      tree->root = pwVar3;
      pwVar1 = pwVar3->llink;
      pwVar3->llink = n;
      n->parent = pwVar3;
      n->rlink = pwVar1;
      if (pwVar1 != (wb_node *)0x0) {
        pwVar1->parent = n;
      }
      pwVar2 = pwVar3->rlink;
      pwVar3->rlink = pwVar4;
      pwVar4->parent = pwVar3;
      pwVar4->llink = pwVar2;
      if (pwVar2 != (wb_node *)0x0) {
        pwVar2->parent = pwVar4;
      }
      uVar6 = 1;
      uVar9 = 1;
      if (n->llink != (wb_node *)0x0) {
        uVar9 = n->llink->weight;
      }
      if (pwVar1 != (wb_node *)0x0) {
        uVar6 = pwVar1->weight;
      }
      n->weight = uVar6 + uVar9;
      uVar8 = 1;
      uVar7 = 1;
      if (pwVar2 != (wb_node *)0x0) {
        uVar7 = pwVar2->weight;
      }
      if (pwVar4->rlink != (wb_node *)0x0) {
        uVar8 = pwVar4->rlink->weight;
      }
      pwVar4->weight = uVar8 + uVar7;
      uVar9 = uVar8 + uVar7 + uVar6 + uVar9;
LAB_001068dd:
      pwVar3->weight = uVar9;
      return 2;
    }
  }
  else {
    if (uVar5 <= n->weight * 0x2c3) {
      return 0;
    }
    if (pwVar4 != (wb_node *)0x0) {
      if (pwVar4->llink == (wb_node *)0x0) {
        uVar9 = 1;
      }
      else {
        uVar9 = pwVar4->llink->weight;
      }
      if (pwVar4->weight * 0x19e < uVar9 * 1000) {
        tree_node_rot_right(tree,n);
        uVar7 = 1;
        uVar6 = 1;
        if (n->llink != (wb_node *)0x0) {
          uVar6 = n->llink->weight;
        }
        if (n->rlink != (wb_node *)0x0) {
          uVar7 = n->rlink->weight;
        }
        n->weight = uVar7 + uVar6;
        pwVar4->weight = uVar7 + uVar6 + uVar9;
        return 1;
      }
      pwVar3 = pwVar4->rlink;
      if (pwVar3 != (wb_node *)0x0) {
        pwVar1 = n->parent;
        pwVar3->parent = pwVar1;
        if (pwVar1 != (wb_node *)0x0) {
          tree = (wb_tree *)&pwVar1->rlink;
          if (pwVar1->llink == n) {
            tree = (wb_tree *)&pwVar1->llink;
          }
        }
        tree->root = pwVar3;
        pwVar1 = pwVar3->llink;
        pwVar3->llink = pwVar4;
        pwVar4->parent = pwVar3;
        pwVar4->rlink = pwVar1;
        if (pwVar1 != (wb_node *)0x0) {
          pwVar1->parent = pwVar4;
        }
        pwVar2 = pwVar3->rlink;
        pwVar3->rlink = n;
        n->parent = pwVar3;
        n->llink = pwVar2;
        uVar6 = 1;
        uVar9 = 1;
        if (pwVar2 != (wb_node *)0x0) {
          pwVar2->parent = n;
          uVar9 = pwVar2->weight;
        }
        if (n->rlink != (wb_node *)0x0) {
          uVar6 = n->rlink->weight;
        }
        n->weight = uVar6 + uVar9;
        uVar8 = 1;
        uVar7 = 1;
        if (pwVar4->llink != (wb_node *)0x0) {
          uVar7 = pwVar4->llink->weight;
        }
        if (pwVar1 != (wb_node *)0x0) {
          uVar8 = pwVar1->weight;
        }
        pwVar4->weight = uVar8 + uVar7;
        uVar9 = uVar8 + uVar7 + uVar6 + uVar9;
        goto LAB_001068dd;
      }
      goto LAB_001068f9;
    }
LAB_001068ef:
    fixup_cold_2();
  }
  fixup_cold_3();
LAB_001068f9:
  fixup_cold_1();
  pwVar4 = (wb_node *)tree_search_node(n,key);
  if (pwVar4 == (wb_node *)0x0) {
    tree->root = (wb_node *)0x0;
    tree->count = 0;
    tree->cmp_func = (dict_compare_func)0x0;
  }
  else {
    tree->root = (wb_node *)pwVar4->key;
    tree->count = (size_t)pwVar4->datum;
    *(undefined1 *)&tree->cmp_func = 1;
    remove_node((wb_tree *)n,pwVar4);
  }
  return (uint)tree;
}

Assistant:

static inline unsigned
fixup(wb_tree* tree, wb_node* n)
{
    unsigned rotations = 0;
    unsigned weight = WEIGHT(n->llink);
    if (weight * 1000U < n->weight * 293U) {
	wb_node* nr = n->rlink;
	ASSERT(nr != NULL);
	wb_node* nrl = nr->llink;
	if (WEIGHT(nrl) * 1000U < nr->weight * 586U) {	/* LL */
	    /* Rotate |n| left. */
	    tree_node_rot_left(tree, n);
	    nr->weight = (n->weight = WEIGHT(n->llink) + WEIGHT(n->rlink)) +
			 WEIGHT(nr->rlink);
	    rotations += 1;
	} else {					/* RL */
	    /* Rotate |nr| right, then |n| left. */
	    ASSERT(nrl != NULL);
	    wb_node* const p = n->parent;
	    nrl->parent = p;
	    *(p ? (p->llink == n ? &p->llink : &p->rlink) : &tree->root) = nrl;

	    wb_node* const a = nrl->llink;
	    nrl->llink = n;
	    n->parent = nrl;
	    if ((n->rlink = a) != NULL)
		a->parent = n;

	    wb_node* const b = nrl->rlink;
	    nrl->rlink = nr;
	    nr->parent = nrl;
	    if ((nr->llink = b) != NULL)
		b->parent = nr;

	    nrl->weight = (n->weight = WEIGHT(n->llink) + WEIGHT(a)) +
			  (nr->weight = WEIGHT(b) + WEIGHT(nr->rlink));
	    rotations += 2;
	}
    } else if (weight * 1000U > n->weight * 707U) {
	wb_node* nl = n->llink;
	ASSERT(nl != NULL);
	weight = WEIGHT(nl->llink);
	if (weight * 1000U > nl->weight * 414U) {	/* RR */
	    tree_node_rot_right(tree, n);

	    n->weight = WEIGHT(n->llink) + WEIGHT(n->rlink);
	    nl->weight = weight + n->weight;
	    rotations += 1;
	} else {					/* LR */
	    /* Rotate |nl| left, then |n| right. */
	    wb_node* nlr = nl->rlink;
	    ASSERT(nlr != NULL);
	    wb_node* const p = n->parent;
	    nlr->parent = p;
	    *(p ? (p->llink == n ? &p->llink : &p->rlink) : &tree->root) = nlr;

	    wb_node* const a = nlr->llink;
	    nlr->llink = nl;
	    nl->parent = nlr;
	    if ((nl->rlink = a) != NULL)
		a->parent = nl;

	    wb_node* const b = nlr->rlink;
	    nlr->rlink = n;
	    n->parent = nlr;
	    if ((n->llink = b) != NULL)
		b->parent = n;

	    nlr->weight = (n->weight = WEIGHT(b) + WEIGHT(n->rlink)) +
			  (nl->weight = WEIGHT(nl->llink) + WEIGHT(a));
	    rotations += 2;
	}
    }
    return rotations;
}